

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O2

void __thiscall QtMWidgets::AbstractScrollArea::wheelEvent(AbstractScrollArea *this,QWheelEvent *e)

{
  AbstractScrollAreaPrivate *pAVar1;
  long lVar2;
  ulong uVar3;
  int dy;
  ulong uVar4;
  
  uVar3 = *(ulong *)(e + 0x50);
  uVar4 = *(ulong *)(e + 0x58);
  AbstractScrollAreaPrivate::stopAnimatingBlurEffect((this->d).d);
  if (uVar3 == 0) {
    if (uVar4 == 0) goto LAB_0016854e;
    uVar4 = (long)((ulong)(uint)((long)uVar4 >> 0x3f) << 0x20 | uVar4 >> 0x20) / 8;
    pAVar1 = (this->d).d;
    if (*(int *)(e + 0x20) == 0x2000000) {
      AbstractScrollAreaPrivate::scrollContentsBy(pAVar1,(int)uVar4,0);
      lVar2 = *(long *)this;
      goto LAB_0016851a;
    }
    AbstractScrollAreaPrivate::scrollContentsBy(pAVar1,0,(int)uVar4);
    lVar2 = *(long *)this;
    uVar3 = 0;
    uVar4 = uVar4 & 0xffffffff;
  }
  else {
    uVar4 = uVar3 >> 0x20;
    pAVar1 = (this->d).d;
    dy = (int)(uVar3 >> 0x20);
    if (*(int *)(e + 0x20) == 0x2000000) {
      AbstractScrollAreaPrivate::scrollContentsBy(pAVar1,dy,0);
      lVar2 = *(long *)this;
LAB_0016851a:
      uVar3 = uVar4 & 0xffffffff;
      uVar4 = 0;
    }
    else {
      AbstractScrollAreaPrivate::scrollContentsBy(pAVar1,0,dy);
      lVar2 = *(long *)this;
      uVar3 = 0;
    }
  }
  (**(code **)(lVar2 + 0x1b0))(this,uVar3,uVar4);
LAB_0016854e:
  pAVar1 = (this->d).d;
  if ((pAVar1->horIndicator->policy == ScrollIndicatorAsNeeded) ||
     (pAVar1->vertIndicator->policy == ScrollIndicatorAsNeeded)) {
    AbstractScrollAreaPrivate::animateScrollIndicators(pAVar1);
  }
  QTimer::stop();
  QTimer::start((int)((this->d).d)->startBlurAnimTimer);
  e[0xc] = (QWheelEvent)0x1;
  return;
}

Assistant:

void
AbstractScrollArea::wheelEvent( QWheelEvent * e )
{
	QPoint numPixels = e->pixelDelta();
	QPoint numDegrees = e->angleDelta();

	d->stopAnimatingBlurEffect();

	if( !numPixels.isNull() )
	{
		if( e->modifiers() == Qt::ShiftModifier )
		{
			d->scrollContentsBy( numPixels.y(), 0 );
			scrollContentsBy( numPixels.y(), 0 );
		}
		else
		{
			d->scrollContentsBy( 0, numPixels.y() );
			scrollContentsBy( 0, numPixels.y() );
		}
	}
	else if( !numDegrees.isNull() )
	{
		if( e->modifiers() == Qt::ShiftModifier )
		{
			d->scrollContentsBy( numDegrees.y() / 8, 0 );
			scrollContentsBy( numDegrees.y() / 8, 0 );
		}
		else
		{
			d->scrollContentsBy( 0, numDegrees.y() / 8 );
			scrollContentsBy( 0, numDegrees.y() / 8 );
		}
	}

	if( d->horIndicator->policy == ScrollIndicatorAsNeeded ||
		d->vertIndicator->policy == ScrollIndicatorAsNeeded )
			d->animateScrollIndicators();

	d->startBlurAnimTimer->stop();
	d->startBlurAnimTimer->start( d->animationTimeout );

	e->accept();
}